

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O2

RangeList * __thiscall
SoapySDR::Device::getBandwidthRange
          (RangeList *__return_storage_ptr__,Device *this,int direction,size_t channel)

{
  double *bw;
  pointer pdVar1;
  _Vector_base<double,_std::allocator<double>_> local_50;
  Range local_38;
  
  (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_Device[0x42])(&local_50);
  for (pdVar1 = local_50._M_impl.super__Vector_impl_data._M_start;
      pdVar1 != local_50._M_impl.super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    Range::Range(&local_38,*pdVar1,*pdVar1,0.0);
    std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::emplace_back<SoapySDR::Range>
              (__return_storage_ptr__,&local_38);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

SoapySDR::RangeList SoapySDR::Device::getBandwidthRange(const int direction, const size_t channel) const
{
    SoapySDR::RangeList ranges;
    //call into the older deprecated listBandwidths() call
    for (auto &bw : this->listBandwidths(direction, channel))
    {
        ranges.push_back(SoapySDR::Range(bw, bw));
    }
    return ranges;
}